

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

Texture2DArrayView
vkt::BindingModel::anon_unknown_1::ImageSampleInstanceImages::getRef2DView
          (TextureLevelPyramid *source,deUint32 baseMipLevel,deUint32 baseArraySlice,
          vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
          *levelStorage)

{
  int iVar1;
  uint uVar2;
  int width;
  int height;
  ConstPixelBufferAccess *pCVar3;
  size_type sVar4;
  reference levels;
  Texture2DArrayView TVar5;
  undefined1 local_90 [8];
  ConstPixelBufferAccess cutLevel;
  ConstPixelBufferAccess wholeLevel;
  deUint32 level;
  deUint32 numLevels;
  deUint32 numSlices;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
  *levelStorage_local;
  deUint32 baseArraySlice_local;
  deUint32 baseMipLevel_local;
  TextureLevelPyramid *source_local;
  ConstPixelBufferAccess *local_10;
  
  pCVar3 = tcu::TextureLevelPyramid::getLevel(source,0);
  iVar1 = tcu::ConstPixelBufferAccess::getDepth(pCVar3);
  uVar2 = tcu::TextureLevelPyramid::getNumLevels(source);
  for (wholeLevel.m_data._4_4_ = baseMipLevel; wholeLevel.m_data._4_4_ < uVar2;
      wholeLevel.m_data._4_4_ = wholeLevel.m_data._4_4_ + 1) {
    pCVar3 = tcu::TextureLevelPyramid::getLevel(source,wholeLevel.m_data._4_4_);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)&cutLevel.m_data,pCVar3);
    width = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&cutLevel.m_data);
    height = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&cutLevel.m_data);
    tcu::getSubregion((ConstPixelBufferAccess *)local_90,(ConstPixelBufferAccess *)&cutLevel.m_data,
                      0,0,baseArraySlice,width,height,iVar1 - baseArraySlice);
    std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
    push_back(levelStorage,(value_type *)local_90);
  }
  sVar4 = std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
          size(levelStorage);
  levels = std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::
           front(levelStorage);
  tcu::Texture2DArrayView::Texture2DArrayView((Texture2DArrayView *)&source_local,(int)sVar4,levels)
  ;
  TVar5._4_4_ = 0;
  TVar5.m_numLevels = (uint)source_local;
  TVar5.m_levels = local_10;
  return TVar5;
}

Assistant:

tcu::Texture2DArrayView ImageSampleInstanceImages::getRef2DView (const tcu::TextureLevelPyramid& source, deUint32 baseMipLevel, deUint32 baseArraySlice, std::vector<tcu::ConstPixelBufferAccess>* levelStorage)
{
	DE_ASSERT(levelStorage->empty());

	const deUint32 numSlices = (deUint32)source.getLevel(0).getDepth();
	const deUint32 numLevels = (deUint32)source.getNumLevels();

	// cut pyramid from baseMipLevel
	for (deUint32 level = baseMipLevel; level < numLevels; ++level)
	{
		// cut levels from baseArraySlice
		const tcu::ConstPixelBufferAccess wholeLevel	= source.getLevel(level);
		const tcu::ConstPixelBufferAccess cutLevel		= tcu::getSubregion(wholeLevel, 0, 0, baseArraySlice, wholeLevel.getWidth(), wholeLevel.getHeight(), numSlices - baseArraySlice);
		levelStorage->push_back(cutLevel);
	}

	return tcu::Texture2DArrayView((int)levelStorage->size(), &levelStorage->front());
}